

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O3

cmInstallTargetGenerator *
CreateInstallTargetGenerator
          (cmTarget *target,cmInstallCommandArguments *args,bool impLib,bool forceOpt)

{
  bool bVar1;
  char *dest;
  char *file_permissions;
  MessageLevel message;
  cmInstallTargetGenerator *this;
  string *psVar2;
  cmInstallCommandArguments *pcVar3;
  string *psVar4;
  cmInstallCommandArguments *pcVar5;
  
  message = cmInstallGenerator::SelectMessageLevel(target->Makefile,false);
  this = (cmInstallTargetGenerator *)operator_new(0xe8);
  psVar2 = &cmInstallCommandArguments::EmptyString_abi_cxx11_;
  pcVar5 = args;
  do {
    if ((pcVar5->DestinationString)._M_string_length != 0) {
      psVar4 = &pcVar5->DestinationString;
      goto LAB_002743fd;
    }
    pcVar5 = pcVar5->GenericArguments;
  } while (pcVar5 != (cmInstallCommandArguments *)0x0);
  psVar4 = &cmInstallCommandArguments::EmptyString_abi_cxx11_;
LAB_002743fd:
  dest = (psVar4->_M_dataplus)._M_p;
  pcVar5 = args;
  do {
    if ((pcVar5->PermissionsString)._M_string_length != 0) {
      psVar2 = &pcVar5->PermissionsString;
      break;
    }
    pcVar5 = pcVar5->GenericArguments;
  } while (pcVar5 != (cmInstallCommandArguments *)0x0);
  file_permissions = (psVar2->_M_dataplus)._M_p;
  pcVar5 = args;
  do {
    pcVar3 = pcVar5;
    if ((pcVar3->Configurations).Vector.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pcVar3->Configurations).Vector.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) break;
    pcVar5 = pcVar3->GenericArguments;
  } while (pcVar3->GenericArguments != (cmInstallCommandArguments *)0x0);
  psVar2 = cmInstallCommandArguments::GetComponent_abi_cxx11_(args);
  do {
    bVar1 = (args->Optional).Enabled;
    if (bVar1 != false) break;
    args = args->GenericArguments;
  } while (args != (cmInstallCommandArguments *)0x0);
  cmInstallTargetGenerator::cmInstallTargetGenerator
            (this,target,dest,impLib,file_permissions,&(pcVar3->Configurations).Vector,
             (psVar2->_M_dataplus)._M_p,message,(bool)(bVar1 | forceOpt));
  return this;
}

Assistant:

static cmInstallTargetGenerator* CreateInstallTargetGenerator(cmTarget& target,
     const cmInstallCommandArguments& args, bool impLib, bool forceOpt = false)
{
  cmInstallGenerator::MessageLevel message =
    cmInstallGenerator::SelectMessageLevel(target.GetMakefile());
  return new cmInstallTargetGenerator(target, args.GetDestination().c_str(),
                        impLib, args.GetPermissions().c_str(),
                        args.GetConfigurations(), args.GetComponent().c_str(),
                        message,
                        args.GetOptional() || forceOpt);
}